

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O3

void Imf_3_4::anon_unknown_1::copyCompressionRecord(Header *dst,Header *src)

{
  int iVar1;
  Header *in_RAX;
  pthread_mutex_t *__mutex;
  _Base_ptr p_Var2;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  iterator __position;
  _Base_ptr p_Var6;
  Header *local_28;
  
  local_28 = in_RAX;
  __mutex = (pthread_mutex_t *)getStash();
  if (__mutex == (pthread_mutex_t *)0x0) {
    return;
  }
  iVar1 = pthread_mutex_lock(__mutex);
  if (iVar1 == 0) {
    p_Var2 = *(_Base_ptr *)((long)__mutex + 0x38);
    if (p_Var2 != (_Base_ptr)0x0) {
      p_Var4 = (_Base_ptr)((long)__mutex + 0x30);
      p_Var5 = p_Var2;
      p_Var6 = p_Var4;
      do {
        if (*(Header **)(p_Var5 + 1) >= src) {
          p_Var6 = p_Var5;
        }
        p_Var5 = (&p_Var5->_M_left)[*(Header **)(p_Var5 + 1) < src];
      } while (p_Var5 != (_Base_ptr)0x0);
      __position._M_node = p_Var4;
      if ((p_Var6 == p_Var4) || (src < *(Header **)(p_Var6 + 1))) {
        do {
          if (*(Header **)(p_Var2 + 1) >= dst) {
            __position._M_node = p_Var2;
          }
          p_Var2 = (&p_Var2->_M_left)[*(Header **)(p_Var2 + 1) < dst];
        } while (p_Var2 != (_Base_ptr)0x0);
        if ((__position._M_node != p_Var4) && (*(Header **)(__position._M_node + 1) <= dst)) {
          std::
          map<void_const*,Imf_3_4::(anonymous_namespace)::CompressionRecord,std::less<void_const*>,std::allocator<std::pair<void_const*const,Imf_3_4::(anonymous_namespace)::CompressionRecord>>>
          ::erase_abi_cxx11_((map<void_const*,Imf_3_4::(anonymous_namespace)::CompressionRecord,std::less<void_const*>,std::allocator<std::pair<void_const*const,Imf_3_4::(anonymous_namespace)::CompressionRecord>>>
                              *)&__mutex[1].__data,__position);
        }
      }
      else {
        local_28 = dst;
        pmVar3 = std::
                 map<const_void_*,_Imf_3_4::(anonymous_namespace)::CompressionRecord,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_Imf_3_4::(anonymous_namespace)::CompressionRecord>_>_>
                 ::operator[]((map<const_void_*,_Imf_3_4::(anonymous_namespace)::CompressionRecord,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_Imf_3_4::(anonymous_namespace)::CompressionRecord>_>_>
                               *)&__mutex[1].__data,&local_28);
        *pmVar3 = (mapped_type)p_Var6[1]._M_parent;
      }
    }
    pthread_mutex_unlock(__mutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

static void
copyCompressionRecord (Header* dst, const Header* src)
{
    CompressionStash* s = getStash ();
    if (s)
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lk (s->_mutex);
#endif
        auto i = s->_store.find (src);
        if (i != s->_store.end ()) { s->_store[dst] = i->second; }
        else
        {
            i = s->_store.find (dst);
            if (i != s->_store.end ()) s->_store.erase (i);
        }
    }
}